

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O3

ssize_t __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
write(ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
      *this,int __fd,void *__buf,size_t __n)

{
  basic_streambuf<std::allocator<char>_> *pbVar1;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  transfer_all_t local_41;
  anon_class_24_2_447ba543_for_handler_ local_40;
  const_buffers_1 local_28;
  _Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
  local_18;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  Connection::set_timeout(*(Connection **)*plVar3,(this->config).timeout);
  local_40.session.
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)*plVar3;
  local_18.
  super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_false>
  ._M_head_impl =
       ((((local_40.session.
           super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->connection).
         super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->socket)._M_t.
       super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
       .
       super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_false>
  ;
  pbVar1 = ((local_40.session.
             super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->request_streambuf)._M_t.
           super___uniq_ptr_impl<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
           .super__Head_base<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_false>.
           _M_head_impl;
  local_28.super_const_buffer.data_ = *(void **)&pbVar1->field_0x10;
  local_28.super_const_buffer.size_ =
       *(long *)&pbVar1->field_0x28 - (long)local_28.super_const_buffer.data_;
  local_40.session.
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
  if (local_40.session.
      super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.session.
       super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.session.
            super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.session.
       super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.session.
            super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_40.this = this;
  asio::detail::
  initiate_async_write_buffer_sequence<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
  ::operator()((initiate_async_write_buffer_sequence<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
                *)&local_18,&local_40,&local_28,&local_41);
  sVar2 = extraout_RAX;
  if (local_40.session.
      super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.session.
               super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    sVar2 = extraout_RAX_00;
  }
  return sVar2;
}

Assistant:

void write(const std::shared_ptr<Session> &session) {
      session->connection->set_timeout(config.timeout);
      asio::async_write(*session->connection->socket, session->request_streambuf->data(), [this, session](const error_code &ec, std::size_t /*bytes_transferred*/) {
        auto lock = session->connection->handler_runner->continue_lock();
        if(!lock)
          return;
        if(!ec)
          this->read(session);
        else {
          if(session->connection->attempt_reconnect && ec != error::operation_aborted)
            reconnect(session, ec);
          else
            session->callback(ec);
        }
      });
    }